

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O1

void __thiscall Assembler::instr2Bytes(Assembler *this,string *instrDescr,int regsDescr)

{
  undefined8 in_RAX;
  mapped_type *pmVar1;
  mapped_type *pmVar2;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
           ::operator[](&this->codeBySection,&currentSectionName_abi_cxx11_);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->instrDescription,instrDescr);
  uStack_38 = CONCAT17((char)*pmVar2,(undefined7)uStack_38);
  std::vector<char,_std::allocator<char>_>::emplace_back<char>
            (pmVar1,(char *)((long)&uStack_38 + 7));
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
           ::operator[](&this->codeBySection,&currentSectionName_abi_cxx11_);
  uStack_38._0_7_ = CONCAT16((char)regsDescr,(undefined6)uStack_38);
  std::vector<char,_std::allocator<char>_>::emplace_back<char>
            (pmVar1,(char *)((long)&uStack_38 + 6));
  return;
}

Assistant:

void Assembler::instr2Bytes(string instrDescr, int regsDescr) {

    codeBySection[currentSectionName].push_back(instrDescription[instrDescr]);
    codeBySection[currentSectionName].push_back(regsDescr);

    return;
}